

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.h
# Opt level: O0

void __thiscall
soinn::ESOINN::serialize<boost::archive::xml_iarchive>(ESOINN *this,xml_iarchive *ar,uint version)

{
  interface_iarchive<boost::archive::xml_iarchive> *piVar1;
  nvp<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>_>
  local_a0;
  nvp<double> local_90;
  nvp<double> local_80;
  nvp<int> local_70;
  nvp<int> local_60;
  nvp<int> local_50;
  nvp<int> local_40;
  nvp<int> local_30;
  uint local_1c;
  interface_iarchive<boost::archive::xml_iarchive> *piStack_18;
  uint version_local;
  xml_iarchive *ar_local;
  ESOINN *this_local;
  
  local_1c = version;
  piStack_18 = (interface_iarchive<boost::archive::xml_iarchive> *)ar;
  ar_local = (xml_iarchive *)this;
  local_30 = boost::serialization::make_nvp<int>("dim",&this->dim);
  boost::archive::detail::interface_iarchive<boost::archive::xml_iarchive>::operator&
            ((interface_iarchive<boost::archive::xml_iarchive> *)ar,&local_30);
  piVar1 = piStack_18;
  local_40 = boost::serialization::make_nvp<int>("ageMax",&this->ageMax);
  boost::archive::detail::interface_iarchive<boost::archive::xml_iarchive>::operator&
            (piVar1,&local_40);
  piVar1 = piStack_18;
  local_50 = boost::serialization::make_nvp<int>("iterationCount",&this->iterationCount);
  boost::archive::detail::interface_iarchive<boost::archive::xml_iarchive>::operator&
            (piVar1,&local_50);
  piVar1 = piStack_18;
  local_60 = boost::serialization::make_nvp<int>("iterationThreshold",&this->iterationThreshold);
  boost::archive::detail::interface_iarchive<boost::archive::xml_iarchive>::operator&
            (piVar1,&local_60);
  piVar1 = piStack_18;
  local_70 = boost::serialization::make_nvp<int>("numberOfClasses",&this->numberOfClasses);
  boost::archive::detail::interface_iarchive<boost::archive::xml_iarchive>::operator&
            (piVar1,&local_70);
  piVar1 = piStack_18;
  local_80 = boost::serialization::make_nvp<double>("c1",&this->c1);
  boost::archive::detail::interface_iarchive<boost::archive::xml_iarchive>::operator&
            (piVar1,&local_80);
  piVar1 = piStack_18;
  local_90 = boost::serialization::make_nvp<double>("c2",&this->c2);
  boost::archive::detail::interface_iarchive<boost::archive::xml_iarchive>::operator&
            (piVar1,&local_90);
  piVar1 = piStack_18;
  local_a0 = boost::serialization::
             make_nvp<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>>
                       ("graph",&this->graph);
  boost::archive::detail::interface_iarchive<boost::archive::xml_iarchive>::operator&
            (piVar1,&local_a0);
  return;
}

Assistant:

void serialize(Archive & ar, const unsigned int version) {
        ar & BOOST_SERIALIZATION_NVP(dim);
        ar & BOOST_SERIALIZATION_NVP(ageMax);
        ar & BOOST_SERIALIZATION_NVP(iterationCount);
        ar & BOOST_SERIALIZATION_NVP(iterationThreshold);
        ar & BOOST_SERIALIZATION_NVP(numberOfClasses);
        ar & BOOST_SERIALIZATION_NVP(c1);
        ar & BOOST_SERIALIZATION_NVP(c2);
        ar & BOOST_SERIALIZATION_NVP(graph);
    }